

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_std::create_formatting
          (impl_std *this,locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  utf8_time_put_from_wide *this_00;
  utf8_numpunct_from_wide *puVar1;
  utf8_moneypunct_from_wide<true> *puVar2;
  utf8_moneypunct_from_wide<false> *puVar3;
  base_num_format<char> *pbVar4;
  base_num_format<wchar_t> *__f;
  time_put_from_base<char> *ptVar5;
  utf8_numpunct *this_01;
  utf8_moneypunct<true> *this_02;
  utf8_moneypunct<false> *this_03;
  locale *tmp_3;
  locale tmp;
  locale base;
  locale local_28;
  
  if (type == 2) {
    create_basic_formatting<wchar_t>(this,in,locale_name);
    __f = (base_num_format<wchar_t> *)operator_new(0x10);
    *(undefined4 *)&__f->field_0x8 = 0;
    *(undefined ***)__f = &PTR__facet_001dc1d8;
    std::locale::locale<booster::locale::util::base_num_format<wchar_t>>(&base,(locale *)this,__f);
LAB_001a9be6:
    std::locale::operator=((locale *)this,&base);
  }
  else {
    if (type != 1) {
      std::locale::locale((locale *)this,in);
      return (locale)(_Impl *)this;
    }
    if (utf == utf8_native) {
      std::locale::locale(&base,(locale_name->_M_dataplus)._M_p);
      ptVar5 = (time_put_from_base<char> *)operator_new(0x18);
      time_put_from_base<char>::time_put_from_base(ptVar5,&base,0);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>(&tmp,in,ptVar5);
      this_01 = (utf8_numpunct *)operator_new(0x18);
      utf8_numpunct::utf8_numpunct(this_01,(locale_name->_M_dataplus)._M_p,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct>(&local_28,&tmp,this_01);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      this_02 = (utf8_moneypunct<true> *)operator_new(0x18);
      utf8_moneypunct<true>::utf8_moneypunct(this_02,(locale_name->_M_dataplus)._M_p,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<true>>(&local_28,&tmp,this_02);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      this_03 = (utf8_moneypunct<false> *)operator_new(0x18);
      utf8_moneypunct<false>::utf8_moneypunct(this_03,(locale_name->_M_dataplus)._M_p,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<false>>(&local_28,&tmp,this_03)
      ;
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001dbff0;
      std::locale::locale<booster::locale::util::base_num_format<char>>((locale *)this,&tmp,pbVar4);
    }
    else if (utf == utf8_native_with_wide) {
      std::locale::locale(&base,(locale_name->_M_dataplus)._M_p);
      ptVar5 = (time_put_from_base<char> *)operator_new(0x18);
      time_put_from_base<char>::time_put_from_base(ptVar5,&base,0);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>(&tmp,in,ptVar5);
      puVar1 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar1,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>(&local_28,&tmp,puVar1)
      ;
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      puVar2 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar2,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&tmp,puVar2);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      puVar3 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar3,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&tmp,puVar3);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001dbff0;
      std::locale::locale<booster::locale::util::base_num_format<char>>((locale *)this,&tmp,pbVar4);
    }
    else {
      if (utf != utf8_from_wide) {
        create_basic_formatting<char>(this,in,locale_name);
        pbVar4 = (base_num_format<char> *)operator_new(0x10);
        *(undefined4 *)&pbVar4->field_0x8 = 0;
        *(undefined ***)pbVar4 = &PTR__facet_001dbff0;
        std::locale::locale<booster::locale::util::base_num_format<char>>
                  (&base,(locale *)this,pbVar4);
        goto LAB_001a9be6;
      }
      std::locale::locale(&base,(locale_name->_M_dataplus)._M_p);
      this_00 = (utf8_time_put_from_wide *)operator_new(0x18);
      utf8_time_put_from_wide::utf8_time_put_from_wide(this_00,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_time_put_from_wide>(&tmp,in,this_00);
      puVar1 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar1,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>(&local_28,&tmp,puVar1)
      ;
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      puVar2 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar2,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&tmp,puVar2);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      puVar3 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar3,&base,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&tmp,puVar3);
      std::locale::operator=(&tmp,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001dbff0;
      std::locale::locale<booster::locale::util::base_num_format<char>>((locale *)this,&tmp,pbVar4);
    }
    std::locale::~locale(&tmp);
  }
  std::locale::~locale(&base);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_formatting(  std::locale const &in,
                                std::string const &locale_name,
                                character_facet_type type,
                                utf8_support utf)
{
        switch(type) {
        case char_facet: 
            {
                if(utf == utf8_from_wide ) {
                    std::locale base = std::locale(locale_name.c_str());
                    
                    std::locale tmp = std::locale(in,new utf8_time_put_from_wide(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<true>(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<false>(locale_name.c_str()));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native_with_wide) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else
                {
                    std::locale tmp = create_basic_formatting<char>(in,locale_name);
                    tmp = std::locale(tmp,new util::base_num_format<char>());
                    return tmp;
                }
            }
        case wchar_t_facet:
            {
                std::locale tmp = create_basic_formatting<wchar_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<wchar_t>());
                return tmp;
            }
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            {
                std::locale tmp = create_basic_formatting<char16_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char16_t>());
                return tmp;
            }
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            {
                std::locale tmp = create_basic_formatting<char32_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char32_t>());
                return tmp;
            }
        #endif
        default:
            return in;
        }
}